

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

Vector<unsigned_int,_3> __thiscall
gl4cts::Math::greaterThan<3>(Math *this,Vector<double,_3> *left,Vector<double,_3> *right)

{
  bool bVar1;
  Vector<unsigned_int,_3> *result;
  int i;
  long lVar2;
  Vector<unsigned_int,_3> VVar3;
  Vector<bool,_3> res;
  
  res.m_data[2] = false;
  res.m_data[0] = false;
  res.m_data[1] = false;
  lVar2 = 0;
  do {
    res.m_data[lVar2] =
         right->m_data[lVar2] <= left->m_data[lVar2] && left->m_data[lVar2] != right->m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  *(undefined4 *)(this + 8) = 0;
  *(undefined8 *)this = 0;
  lVar2 = 0;
  do {
    bVar1 = res.m_data[lVar2];
    *(uint *)(this + lVar2 * 4) = (uint)bVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  VVar3.m_data[2]._0_1_ = bVar1;
  VVar3.m_data._0_8_ = this;
  VVar3.m_data[2]._1_3_ = 0;
  return (Vector<unsigned_int,_3>)VVar3.m_data;
}

Assistant:

static tcu::Vector<glw::GLuint, Size> greaterThan(const tcu::Vector<glw::GLdouble, Size>& left,
												  const tcu::Vector<glw::GLdouble, Size>& right)
{
	return convertBvecToUvec(tcu::greaterThan(left, right));
}